

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  TextureType TVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  Texture2D *this_00;
  Texture2D *pTVar11;
  TextureCube *this_01;
  Vector<int,_4> *a;
  int *piVar12;
  TextureCube *pTVar13;
  PixelBufferAccess *pPVar14;
  Vec4 *this_02;
  Vec4 *this_03;
  float fVar15;
  CubeFaceFloatCoords CVar16;
  float local_2f4;
  TextureBinding local_2e8;
  float local_2a0;
  float local_29c;
  float dvdy_1;
  float dudx_1;
  float local_290;
  Vector<float,_3> local_288;
  undefined8 local_27c;
  CubeFaceFloatCoords c01;
  float local_268;
  Vector<float,_3> local_25c;
  float local_250;
  float fStack_24c;
  CubeFaceFloatCoords c10;
  float local_238;
  Vector<float,_3> local_22c;
  undefined8 local_220;
  CubeFaceFloatCoords c00;
  Vector<float,_4> local_200;
  undefined1 local_1f0 [8];
  Vec4 colorB_1;
  Vector<float,_4> local_1d0;
  undefined1 local_1c0 [8];
  Vec4 colorA_1;
  IVec4 swzB;
  IVec4 *swzA;
  int face;
  Vec2 f;
  float fB_1;
  float fA_1;
  int level_1;
  int baseCellSize_1;
  Vec4 cBias_1;
  Vec4 cScale_1;
  float cStep_1;
  float dvdy;
  float dudx;
  Vector<float,_4> local_f8;
  undefined1 local_e8 [8];
  Vec4 colorB;
  Vector<float,_4> local_c8;
  undefined1 local_b8 [8];
  Vec4 colorA;
  float fB;
  float fA;
  int level;
  int baseCellSize;
  Vec4 cBias;
  Vec4 cScale;
  float cStep;
  float proj;
  bool isProj;
  IVec2 viewportSize;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  ShaderTextureFunctionCase *this_local;
  
  if ((initTexture()::texCubeSwz == '\0') &&
     (iVar7 = __cxa_guard_acquire(&initTexture()::texCubeSwz), iVar7 != 0)) {
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz,0,0,1,1);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 1,1,1,0,0);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 2,0,1,0,1);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 3,1,0,1,0);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 4,0,1,1,0);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 5,1,0,0,1);
    __cxa_guard_release(&initTexture()::texCubeSwz);
  }
  fmtInfo.lookupBias.m_data._8_8_ =
       glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&viewportSize,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)&proj);
  bVar6 = anon_unknown_1::functionHasProj((this->m_lookupSpec).function);
  if (bVar6) {
    iVar7 = 3;
    if ((this->m_lookupSpec).function == FUNCTION_TEXTUREPROJ3) {
      iVar7 = 2;
    }
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,iVar7);
    local_2f4 = 1.0 / *pfVar10;
  }
  else {
    local_2f4 = 1.0;
  }
  TVar4 = (this->m_textureSpec).type;
  if (TVar4 == TEXTURETYPE_2D) {
    iVar8 = de::max<int>(1,(this->m_textureSpec).numLevels + -1);
    tcu::operator-((tcu *)(cBias.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)&viewportSize);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&level,(Vector<float,_4> *)&viewportSize);
    iVar7 = (this->m_textureSpec).width;
    iVar9 = (this->m_textureSpec).height;
    if (iVar7 < 0) {
      iVar7 = iVar7 + 3;
    }
    if (iVar9 < 0) {
      iVar9 = iVar9 + 3;
    }
    iVar7 = de::min<int>(iVar7 >> 2,iVar9 >> 2);
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,(this->m_textureSpec).width,
               (this->m_textureSpec).height);
    this->m_texture2D = this_00;
    for (fB = 0.0; (int)fB < (this->m_textureSpec).numLevels; fB = (float)((int)fB + 1)) {
      colorA.m_data[3] = (float)(int)fB * (1.0 / (float)iVar8);
      colorA.m_data[2] = 1.0 - colorA.m_data[3];
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(colorB.m_data + 2),colorA.m_data[3],colorA.m_data[2],
                 colorA.m_data[3],colorA.m_data[2]);
      tcu::operator*((tcu *)&local_c8,(Vector<float,_4> *)(cBias.m_data + 2),
                     (Vector<float,_4> *)(colorB.m_data + 2));
      tcu::operator+((tcu *)local_b8,(Vector<float,_4> *)&level,&local_c8);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&dvdy,colorA.m_data[2],colorA.m_data[3],colorA.m_data[2],
                 colorA.m_data[3]);
      tcu::operator*((tcu *)&local_f8,(Vector<float,_4> *)(cBias.m_data + 2),
                     (Vector<float,_4> *)&dvdy);
      tcu::operator+((tcu *)local_e8,(Vector<float,_4> *)&level,&local_f8);
      pTVar11 = glu::Texture2D::getRefTexture(this->m_texture2D);
      tcu::Texture2D::allocLevel(pTVar11,(int)fB);
      pTVar11 = glu::Texture2D::getRefTexture(this->m_texture2D);
      pPVar14 = tcu::TextureLevelPyramid::getLevel(&pTVar11->super_TextureLevelPyramid,(int)fB);
      iVar9 = de::max<int>(1,iVar7 >> (SUB41(fB,0) & 0x1f));
      tcu::fillWithGrid(pPVar14,iVar9,(Vec4 *)local_b8,(Vec4 *)local_e8);
    }
    (*this->m_texture2D->_vptr_Texture2D[2])();
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,0);
    fVar15 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,0);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).width;
    piVar12 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    iVar9 = *piVar12;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,1);
    fVar1 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,1);
    fVar2 = *pfVar10;
    iVar8 = (this->m_textureSpec).height;
    piVar12 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    fVar15 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,((fVar15 - fVar3) * local_2f4 * (float)iVar7) / (float)iVar9,
                        0.0,0.0,((fVar1 - fVar2) * local_2f4 * (float)iVar8) / (float)*piVar12);
    (this->m_lookupParams).lod = fVar15;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)(cScale_1.m_data + 3),this->m_texture2D,
               &(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,(value_type *)(cScale_1.m_data + 3));
  }
  else if (TVar4 == TEXTURETYPE_CUBE_MAP) {
    iVar7 = de::max<int>(1,(this->m_textureSpec).numLevels + -1);
    cScale_1.m_data[2] = 1.0 / (float)iVar7;
    tcu::operator-((tcu *)(cBias_1.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)&viewportSize);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&level_1,(Vector<float,_4> *)&viewportSize);
    iVar7 = (this->m_textureSpec).width;
    iVar9 = (this->m_textureSpec).height;
    if (iVar7 < 0) {
      iVar7 = iVar7 + 3;
    }
    if (iVar9 < 0) {
      iVar9 = iVar9 + 3;
    }
    iVar7 = de::min<int>(iVar7 >> 2,iVar9 >> 2);
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,(this->m_textureSpec).width);
    this->m_textureCube = this_01;
    for (fB_1 = 0.0; (int)fB_1 < (this->m_textureSpec).numLevels; fB_1 = (float)((int)fB_1 + 1)) {
      f.m_data[1] = (float)(int)fB_1 * cScale_1.m_data[2];
      f.m_data[0] = 1.0 - f.m_data[1];
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)((long)&swzA + 4),f.m_data[1],f.m_data[0]);
      for (swzA._0_4_ = CUBEFACE_NEGATIVE_X; (int)(CubeFace)swzA < 6;
          swzA._0_4_ = (CubeFace)swzA + CUBEFACE_POSITIVE_X) {
        a = initTexture::texCubeSwz + (int)(CubeFace)swzA;
        tcu::operator-((tcu *)(colorA_1.m_data + 2),1,a);
        piVar12 = tcu::Vector<int,_4>::operator[](a,0);
        iVar9 = *piVar12;
        piVar12 = tcu::Vector<int,_4>::operator[](a,1);
        iVar8 = *piVar12;
        piVar12 = tcu::Vector<int,_4>::operator[](a,2);
        iVar5 = *piVar12;
        tcu::Vector<int,_4>::operator[](a,3);
        tcu::Vector<float,_2>::swizzle
                  ((Vector<float,_2> *)(colorB_1.m_data + 2),(int)&swzA + 4,iVar9,iVar8,iVar5);
        tcu::operator*((tcu *)&local_1d0,(Vector<float,_4> *)(cBias_1.m_data + 2),
                       (Vector<float,_4> *)(colorB_1.m_data + 2));
        tcu::operator+((tcu *)local_1c0,(Vector<float,_4> *)&level_1,&local_1d0);
        piVar12 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),0);
        iVar9 = *piVar12;
        piVar12 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),1);
        iVar8 = *piVar12;
        piVar12 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),2);
        iVar5 = *piVar12;
        tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),3);
        tcu::Vector<float,_2>::swizzle((Vector<float,_2> *)&c00.t,(int)&swzA + 4,iVar9,iVar8,iVar5);
        tcu::operator*((tcu *)&local_200,(Vector<float,_4> *)(cBias_1.m_data + 2),
                       (Vector<float,_4> *)&c00.t);
        tcu::operator+((tcu *)local_1f0,(Vector<float,_4> *)&level_1,&local_200);
        pTVar13 = glu::TextureCube::getRefTexture(this->m_textureCube);
        tcu::TextureCube::allocLevel(pTVar13,(CubeFace)swzA,(int)fB_1);
        pTVar13 = glu::TextureCube::getRefTexture(this->m_textureCube);
        pPVar14 = tcu::TextureCube::getLevelFace(pTVar13,(int)fB_1,(CubeFace)swzA);
        iVar9 = de::max<int>(1,iVar7 >> (SUB41(fB_1,0) & 0x1f));
        tcu::fillWithGrid(pPVar14,iVar9,(Vec4 *)local_1c0,(Vec4 *)local_1f0);
      }
    }
    glu::TextureCube::upload(this->m_textureCube);
    this_02 = &(this->m_lookupSpec).minCoord;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,0);
    fVar15 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,1);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,2);
    tcu::Vector<float,_3>::Vector
              (&local_22c,fVar15 * local_2f4,fVar3 * local_2f4,*pfVar10 * local_2f4);
    join_0x00001200_0x00000000_ = tcu::getCubeFaceCoords(&local_22c);
    c00.face = (CubeFace)local_238;
    local_220 = stack0xfffffffffffffdc0;
    this_03 = &(this->m_lookupSpec).maxCoord;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_03,0);
    fVar15 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,1);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,2);
    tcu::Vector<float,_3>::Vector
              (&local_25c,fVar15 * local_2f4,fVar3 * local_2f4,*pfVar10 * local_2f4);
    CVar16 = tcu::getCubeFaceCoords(&local_25c);
    local_268 = CVar16.t;
    c10.face = (CubeFace)local_268;
    c01._4_8_ = CVar16._0_8_;
    local_250 = c01.s;
    fStack_24c = c01.t;
    unique0x10001105 = CVar16;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,0);
    fVar15 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_03,1);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_02,2);
    tcu::Vector<float,_3>::Vector
              (&local_288,fVar15 * local_2f4,fVar3 * local_2f4,*pfVar10 * local_2f4);
    _dvdy_1 = tcu::getCubeFaceCoords(&local_288);
    local_27c = _dvdy_1;
    c01.face = (CubeFace)local_290;
    fVar15 = fStack_24c - local_220._4_4_;
    iVar7 = (this->m_textureSpec).width;
    piVar12 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    local_29c = (fVar15 * (float)iVar7) / (float)*piVar12;
    fVar15 = (float)c01.face - (float)c00.face;
    iVar7 = (this->m_textureSpec).height;
    piVar12 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    local_2a0 = (fVar15 * (float)iVar7) / (float)*piVar12;
    fVar15 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,local_29c,0.0,0.0,local_2a0);
    (this->m_lookupParams).lod = fVar15;
    deqp::gls::TextureBinding::TextureBinding
              (&local_2e8,this->m_textureCube,&(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,&local_2e8);
  }
  *(undefined8 *)(this->m_lookupParams).scale.m_data = fmtInfo.valueMax.m_data._8_8_;
  *(undefined8 *)((this->m_lookupParams).scale.m_data + 2) = fmtInfo.lookupScale.m_data._0_8_;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = fmtInfo.lookupScale.m_data._8_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = fmtInfo.lookupBias.m_data._0_8_;
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);
					tcu::fillWithGrid(m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
}